

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O3

void run_benchmark(char *name,_func_void_void_ptr_int *benchmark,_func_void_void_ptr *setup,
                  _func_void_void_ptr_int *teardown,void *data,int count,int iter)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  timeval tv;
  timeval local_78;
  char *local_68;
  _func_void_void_ptr_int *local_60;
  _func_void_void_ptr *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  lVar3 = 0x7fffffffffffffff;
  iVar5 = 10;
  lVar4 = 0;
  lVar6 = 0;
  local_68 = name;
  local_60 = benchmark;
  local_58 = setup;
  do {
    local_38 = lVar4;
    if (local_58 != (_func_void_void_ptr *)0x0) {
      (*local_58)(data);
    }
    gettimeofday(&local_78,(__timezone_ptr_t)0x0);
    local_48 = local_78.tv_sec;
    local_40 = local_78.tv_usec;
    (*local_60)(data,count);
    gettimeofday(&local_78,(__timezone_ptr_t)0x0);
    _Var2 = local_78.tv_usec;
    _Var1 = local_78.tv_sec;
    if (teardown != (_func_void_void_ptr_int *)0x0) {
      local_50 = lVar6;
      (*teardown)(data,count);
      lVar6 = local_50;
    }
    lVar7 = (_Var2 - local_40) + (_Var1 - local_48) * 1000000;
    if (lVar7 < lVar3) {
      lVar3 = lVar7;
    }
    lVar4 = local_38;
    if (local_38 < lVar7) {
      lVar4 = lVar7;
    }
    lVar6 = lVar6 + lVar7;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("%-30s, ",local_68);
  lVar7 = (long)count;
  print_number((lVar3 * 1000000) / lVar7);
  printf("   , ");
  print_number((lVar6 * 100000) / lVar7);
  printf("   , ");
  print_number((lVar4 * 1000000) / lVar7);
  putchar(10);
  return;
}

Assistant:

static void run_benchmark(char *name, void (*benchmark)(void*, int), void (*setup)(void*), void (*teardown)(void*, int), void* data, int count, int iter) {
    int i;
    int64_t min = INT64_MAX;
    int64_t sum = 0;
    int64_t max = 0;
    for (i = 0; i < count; i++) {
        int64_t begin, total;
        if (setup != NULL) {
            setup(data);
        }
        begin = gettime_i64();
        benchmark(data, iter);
        total = gettime_i64() - begin;
        if (teardown != NULL) {
            teardown(data, iter);
        }
        if (total < min) {
            min = total;
        }
        if (total > max) {
            max = total;
        }
        sum += total;
    }
    /* ',' is used as a column delimiter */
    printf("%-30s, ", name);
    print_number(min * FP_MULT / iter);
    printf("   , ");
    print_number(((sum * FP_MULT) / count) / iter);
    printf("   , ");
    print_number(max * FP_MULT / iter);
    printf("\n");
}